

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O3

void glmc_rotate_make(vec4 *m,float angle,float *axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = cosf(angle);
  fVar2 = axis[2];
  fVar8 = 1.0 - fVar1;
  fVar7 = (float)*(undefined8 *)axis;
  fVar5 = (float)((ulong)*(undefined8 *)axis >> 0x20);
  fVar6 = SQRT(fVar2 * fVar2 + fVar7 * fVar7 + fVar5 * fVar5);
  fVar3 = 1.0 / fVar6;
  fVar4 = (float)(~((int)((uint)(fVar6 < 1.1920929e-07) << 0x1f) >> 0x1f) & (uint)(fVar3 * fVar7));
  fVar5 = (float)(~((int)((uint)(fVar6 < 1.1920929e-07) << 0x1f) >> 0x1f) & (uint)(fVar3 * fVar5));
  fVar7 = 0.0;
  if (1.1920929e-07 <= fVar6) {
    fVar7 = fVar3 * fVar2;
  }
  fVar2 = fVar8 * fVar4;
  fVar6 = fVar8 * fVar5;
  fVar8 = fVar8 * fVar7;
  fVar3 = sinf(angle);
  m[1][0] = fVar4 * fVar6 - fVar7 * fVar3;
  m[2][0] = fVar4 * fVar8 + fVar5 * fVar3;
  *(ulong *)*m = CONCAT44(fVar7 * fVar3 + fVar2 * fVar5,fVar1 + fVar2 * fVar4);
  (*m)[2] = fVar2 * fVar7 - fVar5 * fVar3;
  m[2][1] = fVar5 * fVar8 - fVar3 * fVar4;
  *(ulong *)(m[1] + 1) = CONCAT44(fVar3 * fVar4 + fVar7 * fVar6,fVar6 * fVar5 + fVar1);
  m[2][2] = fVar8 * fVar7 + fVar1;
  m[1][3] = 0.0;
  (*m)[3] = 0.0;
  *(undefined8 *)(m[2] + 3) = 0;
  *(float *)((long)(m + 3) + 4) = 0.0;
  *(float *)((long)(m + 3) + 8) = 0.0;
  m[3][3] = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate_make(mat4 m, float angle, vec3 axis) {
  glm_rotate_make(m, angle, axis);
}